

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeTransformMatrix
          (ChElementBeamTaperedTimoshenko *this)

{
  ChMatrixDynamic<> *this_00;
  bool bVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scalar *pSVar7;
  double in_XMM0_Qa;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar15;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar16;
  undefined1 auVar24 [16];
  double dVar17;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  ulong in_XMM0_Qb;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar28 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  ChMatrixNM<double,_12,_12> Rotsect;
  ChMatrix33<double> rc;
  ChMatrix33<double> RotsectB;
  ChMatrixNM<double,_6,_6> Ts1;
  ChMatrix33<double> RotsectA;
  ChMatrixNM<double,_12,_12> Tc;
  ChMatrixNM<double,_6,_6> Ts2;
  ChMatrixNM<double,_6,_6> Tc2;
  ChMatrixNM<double,_6,_6> Tc1;
  ChMatrixNM<double,_12,_12> Ts;
  undefined4 local_14d0;
  undefined4 uStack_14cc;
  undefined4 uStack_14c8;
  uint uStack_14c4;
  undefined4 local_14c0;
  undefined4 uStack_14bc;
  undefined4 uStack_14b8;
  uint uStack_14b4;
  undefined4 uStack_1448;
  uint uStack_1444;
  undefined4 uStack_1438;
  uint uStack_1434;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
  local_1400;
  undefined1 local_13f0 [16];
  Matrix<double,_12,_12,_1,_12,_12> *local_13e0;
  variable_if_dynamic<long,__1> local_13d8;
  variable_if_dynamic<long,__1> vStack_13d0;
  Index local_13c8;
  undefined1 local_13c0 [312];
  double local_1288 [39];
  double local_1150 [39];
  double local_1018 [33];
  undefined1 local_f10 [32];
  undefined1 local_ef0 [16];
  double local_ee0;
  double local_ed8;
  double local_ed0;
  ChMatrix33<double> local_ec8;
  Matrix<double,_6,_6,_1,_6,_6> local_e80;
  ChMatrix33<double> local_d48;
  Matrix<double,_12,_12,_1,_12,_12> local_d00;
  Matrix<double,_6,_6,_1,_6,_6> local_860;
  Matrix<double,_6,_6,_1,_6,_6> local_740;
  MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> local_620 [32];
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined8 local_5f8;
  undefined8 local_5d8;
  undefined4 local_5a8;
  undefined4 uStack_5a4;
  undefined1 local_500 [1232];
  undefined1 extraout_var [56];
  
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  *)local_13c0,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*(((ChBeamSectionRayleighAdvancedGeneric *)local_13c0._0_8_)->
    super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[6])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_13c0 + 8));
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  *)local_13c0,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*(((ChBeamSectionRayleighAdvancedGeneric *)local_13c0._0_8_)->
    super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[7])();
  dVar8 = in_XMM0_Qa;
  uVar29 = in_XMM0_Qb;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_13c0 + 8));
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  *)local_13c0,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*(((ChBeamSectionRayleighAdvancedGeneric *)local_13c0._0_8_)->
    super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[8])();
  dVar9 = dVar8;
  uVar30 = uVar29;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_13c0 + 8));
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  *)local_13c0,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*(((ChBeamSectionRayleighAdvancedGeneric *)local_13c0._0_8_)->
    super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[9])();
  dVar10 = dVar9;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_13c0 + 8));
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  *)local_13c0,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*(((ChBeamSectionRayleighAdvancedGeneric *)local_13c0._0_8_)->
    super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[10])();
  dVar11 = dVar10;
  uVar31 = uVar30;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_13c0 + 8));
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  *)local_13c0,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*(((ChBeamSectionRayleighAdvancedGeneric *)local_13c0._0_8_)->
    super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[6])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_13c0 + 8));
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  *)local_13c0,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*(((ChBeamSectionRayleighAdvancedGeneric *)local_13c0._0_8_)->
    super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[7])();
  dVar12 = dVar11;
  uVar32 = uVar31;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_13c0 + 8));
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  *)local_13c0,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*(((ChBeamSectionRayleighAdvancedGeneric *)local_13c0._0_8_)->
    super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[8])();
  dVar13 = dVar12;
  uVar33 = uVar32;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_13c0 + 8));
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  *)local_13c0,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*(((ChBeamSectionRayleighAdvancedGeneric *)local_13c0._0_8_)->
    super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[9])();
  dVar14 = dVar13;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_13c0 + 8));
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  *)local_13c0,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*(((ChBeamSectionRayleighAdvancedGeneric *)local_13c0._0_8_)->
    super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[10])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_13c0 + 8));
  dVar16 = (this->super_ChElementBeam).length;
  local_13c0._8_16_ = ZEXT816(0) << 0x20;
  ChMatrix33<double>::Set_A_Rxyz(&local_d48,(ChVector<double> *)local_13c0);
  local_13c0._8_16_ = ZEXT816(0) << 0x20;
  ChMatrix33<double>::Set_A_Rxyz(&local_ec8,(ChVector<double> *)local_13c0);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_13c0);
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [3] = 0.0;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [4] = 0.0;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_13c0;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [2] = (double)local_13c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)&local_d00,
             &local_d48.super_Matrix<double,_3,_3,_1,_3,_3>);
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_1288;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [3] = 1.48219693752374e-323;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [2] = (double)local_13c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)&local_d00,
             &local_d48.super_Matrix<double,_3,_3,_1,_3,_3>);
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_1150;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [3] = 2.96439387504748e-323;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [4] = 2.96439387504748e-323;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [2] = (double)local_13c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)&local_d00,
             &local_ec8.super_Matrix<double,_3,_3,_1,_3,_3>);
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [0] = (double)local_1018;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [3] = 4.44659081257122e-323;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [4] = 4.44659081257122e-323;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.array
  [2] = (double)local_13c0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)&local_d00,
             &local_ec8.super_Matrix<double,_3,_3,_1,_3,_3>);
  dVar17 = dVar11 - in_XMM0_Qa;
  dVar2 = dVar12 - dVar8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar16;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar17 * dVar17;
  auVar4 = vfmsub213sd_fma(auVar4,auVar4,auVar37);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar2;
  auVar4 = vfnmadd231sd_fma(auVar4,auVar18,auVar34);
  auVar28._0_8_ = pow(auVar4._0_8_,0.5);
  auVar28._8_56_ = extraout_var;
  auVar18 = auVar28._0_16_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar17 * dVar17;
  auVar4 = vfmadd231sd_fma(auVar19,auVar18,auVar18);
  dVar15 = pow(auVar4._0_8_,0.5);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_false>::run
            ((Matrix<double,_3,_3,_1,_3,_3> *)local_f10);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar17;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar16;
  auVar6._8_8_ = extraout_XMM0_Qb;
  auVar6._0_8_ = dVar15;
  auVar38._0_8_ = -dVar17;
  auVar38._8_8_ = 0x8000000000000000;
  auVar4 = vunpcklpd_avx(auVar18,auVar3);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar2 * auVar28._0_8_;
  auVar3 = vunpcklpd_avx(auVar20,auVar38);
  auVar27._16_16_ = auVar3;
  auVar27._0_16_ = auVar4;
  auVar4 = vunpcklpd_avx(auVar5,auVar6);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar16 * dVar15;
  auVar42._16_8_ = dVar16 * dVar15;
  auVar42._0_16_ = auVar4;
  auVar42._24_8_ = 0;
  auVar4 = vunpcklpd_avx(auVar6,auVar35);
  auVar42 = vpermpd_avx2(auVar42,0x24);
  local_f10 = vdivpd_avx(auVar27,auVar42);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2 * auVar38._0_8_;
  auVar3 = vunpcklpd_avx(auVar18,auVar21);
  local_ef0 = vdivpd_avx(auVar3,auVar4);
  local_ed0 = dVar15 / dVar16;
  local_ee0 = -dVar2 / dVar16;
  local_ed8 = 0.0;
  if (this->use_Rc == true) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)&local_d00,&this->Rc,
               0,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)&local_d00,
               (Matrix<double,_3,_3,_1,_3,_3> *)local_f10);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)&local_d00,&this->Rc,
               3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)&local_d00,
               (Matrix<double,_3,_3,_1,_3,_3> *)local_f10);
  }
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run
            ((Matrix<double,_6,_6,_1,_6,_6> *)local_620);
  local_14d0 = SUB84(dVar8,0);
  uStack_14cc = (undefined4)((ulong)dVar8 >> 0x20);
  uStack_14c8 = (undefined4)uVar29;
  uStack_14c4 = (uint)(uVar29 >> 0x20);
  local_14c0 = SUB84(in_XMM0_Qa,0);
  uStack_14bc = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  uStack_14b8 = (undefined4)in_XMM0_Qb;
  uStack_14b4 = (uint)(in_XMM0_Qb >> 0x20);
  local_600 = local_14d0;
  uStack_5fc = uStack_14cc;
  auVar22._0_8_ = -in_XMM0_Qa;
  auVar22._8_4_ = uStack_14b8;
  auVar22._12_4_ = uStack_14b4 ^ 0x80000000;
  auVar39._0_8_ = -dVar8;
  auVar39._8_4_ = uStack_14c8;
  auVar39._12_4_ = uStack_14c4 ^ 0x80000000;
  local_5f8 = vmovlps_avx(auVar22);
  local_5d8 = vmovlps_avx(auVar39);
  local_5a8 = local_14c0;
  uStack_5a4 = uStack_14bc;
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run(&local_740);
  auVar23._0_8_ = -dVar11;
  auVar23._8_8_ = uVar31 ^ 0x8000000000000000;
  auVar40._0_8_ = -dVar12;
  auVar40._8_8_ = uVar32 ^ 0x8000000000000000;
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[5] =
       (double)vmovlpd_avx(auVar23);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9] =
       (double)vmovlpd_avx(auVar40);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_true>::run(&local_d00)
  ;
  local_e80.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array.
  _0_16_ = Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator*
                     (local_620,(MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&this->Rc);
  local_500._24_8_ = 0;
  local_500._32_8_ = 0;
  local_500._40_8_ = 5.92878775009496e-323;
  local_500._0_8_ = &local_d00;
  local_500._16_8_ = &local_d00;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_500,
             (Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
              *)&local_e80);
  local_e80.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array.
  _0_16_ = Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)&local_740,
                      (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&this->Rc);
  local_500._0_8_ =
       local_d00.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array + 0x4e;
  local_500._16_8_ = &local_d00;
  local_500._24_8_ = 6;
  local_500._32_8_ = 6;
  local_500._40_8_ = 5.92878775009496e-323;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_500,
             (Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
              *)&local_e80);
  dVar9 = dVar9 - dVar13;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar9 * dVar9;
  auVar4 = vfmadd231sd_fma(auVar41,auVar18,auVar18);
  dVar16 = pow(auVar4._0_8_,0.5);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar10 - dVar14;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar4._0_8_;
  auVar4 = vfmadd231sd_fma(auVar36,auVar24,auVar24);
  dVar17 = pow(auVar4._0_8_,0.5);
  bVar1 = this->use_simplified_correction_for_inclined_shear_axis;
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run(&local_e80);
  uStack_1438 = (undefined4)uVar30;
  uStack_1434 = (uint)(uVar30 >> 0x20);
  auVar25._0_8_ = -dVar10;
  auVar25._8_4_ = uStack_1438;
  auVar25._12_4_ = uStack_1434 ^ 0x80000000;
  local_e80.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9] =
       (double)vmovlps_avx(auVar25);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run(&local_860);
  uStack_1448 = (undefined4)uVar33;
  uStack_1444 = (uint)(uVar33 >> 0x20);
  auVar26._0_8_ = -dVar14;
  auVar26._8_4_ = uStack_1448;
  auVar26._12_4_ = uStack_1444 ^ 0x80000000;
  local_860.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9] =
       (double)vmovlps_avx(auVar26);
  if (this->use_Rs == true) {
    this_00 = &this->Rs;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,3,3)
    ;
    *pSVar7 = dVar17 / auVar28._0_8_;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,4,3)
    ;
    *pSVar7 = (Scalar)((ulong)(bVar1 & 1) * (long)(dVar9 / auVar28._0_8_) +
                      (ulong)!(bool)(bVar1 & 1) *
                      (long)((dVar9 * dVar17) / (auVar28._0_8_ * dVar16)));
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,5,3)
    ;
    *pSVar7 = (dVar10 - dVar14) /
              (double)((ulong)(bVar1 & 1) * (long)auVar28._0_8_ +
                      (ulong)!(bool)(bVar1 & 1) * (long)dVar16);
  }
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_true>::run
            ((Matrix<double,_12,_12,_1,_12,_12> *)local_500);
  local_1400 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Rs,
                          (MatrixBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&local_e80);
  local_13d8.m_value = 0;
  vStack_13d0.m_value = 0;
  local_13c8 = 0xc;
  local_13f0._0_8_ = (Matrix<double,_12,_12,_1,_12,_12> *)local_500;
  local_13e0 = (Matrix<double,_12,_12,_1,_12,_12> *)local_500;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,6,6,1,6,6>,0>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_13f0,&local_1400)
  ;
  local_1400 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Rs,
                          (MatrixBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&local_860);
  local_13f0._0_8_ = local_500 + 0x270;
  local_13d8.m_value = 6;
  vStack_13d0.m_value = 6;
  local_13c8 = 0xc;
  local_13e0 = (Matrix<double,_12,_12,_1,_12,_12> *)local_500;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,6,6,1,6,6>,0>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_13f0,&local_1400)
  ;
  local_13f0._0_8_ = local_13c0;
  local_13e0 = &local_d00;
  local_13f0._8_8_ = (Matrix<double,_12,_12,_1,_12,_12> *)local_500;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,0>>
            (&this->T,(Product<Eigen::Product<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
                       *)local_13f0);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeTransformMatrix() {
    double alpha1 = this->tapered_section->GetSectionA()->GetSectionRotation();
    double Cy1 = this->tapered_section->GetSectionA()->GetCentroidY();
    double Cz1 = this->tapered_section->GetSectionA()->GetCentroidZ();
    double Sy1 = this->tapered_section->GetSectionA()->GetShearCenterY();
    double Sz1 = this->tapered_section->GetSectionA()->GetShearCenterZ();

    double alpha2 = this->tapered_section->GetSectionB()->GetSectionRotation();
    double Cy2 = this->tapered_section->GetSectionB()->GetCentroidY();
    double Cz2 = this->tapered_section->GetSectionB()->GetCentroidZ();
    double Sy2 = this->tapered_section->GetSectionB()->GetShearCenterY();
    double Sz2 = this->tapered_section->GetSectionB()->GetShearCenterZ();

    double L = this->length;

    // In case the section is rotated:
    ChMatrix33<> RotsectA;
    RotsectA.Set_A_Rxyz(ChVector<>(alpha1, 0, 0));
    ChMatrix33<> RotsectB;
    RotsectB.Set_A_Rxyz(ChVector<>(alpha2, 0, 0));
    ChMatrixNM<double, 12, 12> Rotsect;
    Rotsect.setZero();
    Rotsect.block<3, 3>(0, 0) = RotsectA;
    Rotsect.block<3, 3>(3, 3) = RotsectA;
    Rotsect.block<3, 3>(6, 6) = RotsectB;
    Rotsect.block<3, 3>(9, 9) = RotsectB;

    // In case the section has a centroid displacement:
    // double dCx = 0;
    double dCy = Cy2 - Cy1;
    double dCz = Cz2 - Cz1;
    double LN = L;
    double LG = pow(LN * LN - dCy * dCy - dCz * dCz, 0.5);
    double LA = LG;
    double LB = pow(LG * LG + dCy * dCy, 0.5);
    ChMatrix33<> rc;
    rc.setIdentity();
    rc(0, 0) = LA / LN;
    rc(0, 1) = dCy / LB;
    rc(0, 2) = LA * dCz / (LN * LB);
    rc(1, 0) = -dCy / LN;
    rc(1, 1) = LA / LB;
    rc(1, 2) = -dCy * dCz / (LN * LB);
    rc(2, 0) = -dCz / LN;
    rc(2, 1) = 0.0;
    rc(2, 2) = LB / LN;
    // ChMatrixNM<double, 6, 6> Rc;
    // Rc.setIdentity();
    if (use_Rc) {
        this->Rc.block<3, 3>(0, 0) = rc;
        this->Rc.block<3, 3>(3, 3) = rc;
    }

    ChMatrixNM<double, 6, 6> Tc1;
    Tc1.setIdentity();
    Tc1(0, 4) = Cz1;
    Tc1(0, 5) = -Cy1;
    Tc1(1, 3) = -Cz1;
    Tc1(2, 3) = Cy1;

    ChMatrixNM<double, 6, 6> Tc2;
    Tc2.setIdentity();
    Tc2(0, 4) = Cz2;
    Tc2(0, 5) = -Cy2;
    Tc2(1, 3) = -Cz2;
    Tc2(2, 3) = Cy2;

    ChMatrixNM<double, 12, 12> Tc;
    Tc.setIdentity();
    Tc.block<6, 6>(0, 0) = Tc1 * Rc;
    Tc.block<6, 6>(6, 6) = Tc2 * Rc;

    // In case the section has a shear center displacement:
    // The shear center offset is respect to the centerline of beam element.
    /*Sy1 = Sy1 - Cy1;  // Unnecessary to do this substraction
    Sz1 = Sz1 - Cz1;
    Sy2 = Sy2 - Cy2;
    Sz2 = Sz2 - Cz2;*/
    double dSy = Sy1 - Sy2;
    double dSz = Sz1 - Sz2;

    double Lsy = pow(LG * LG + dSy * dSy, 0.5);
    double Lsyz = pow(LG * LG + dSy * dSy + dSz * dSz, 0.5);
    double C1 = Lsyz / LG;
    double C2 = dSy * Lsyz / (LG * Lsy);
    double C3 = dSz / Lsy;
    if (this->use_simplified_correction_for_inclined_shear_axis) {
        C1 = Lsyz / LG;
        C2 = dSy / LG;
        C3 = dSz / LG;
    }

    ChMatrixNM<double, 6, 6> Ts1;
    Ts1.setIdentity();
    Ts1(1, 3) = -Sz1;
    Ts1(2, 3) = Sy1;

    ChMatrixNM<double, 6, 6> Ts2;
    Ts2.setIdentity();
    Ts2(1, 3) = -Sz2;
    Ts2(2, 3) = Sy2;

    // ChMatrixNM<double, 6, 6> Rs;
    // Rs.setIdentity();
    if (use_Rs) {
        this->Rs(3, 3) = C1;
        this->Rs(4, 3) = C2;
        this->Rs(5, 3) = C3;
    }

    ChMatrixNM<double, 12, 12> Ts;
    Ts.setIdentity();
    Ts.block<6, 6>(0, 0) = Rs * Ts1;
    Ts.block<6, 6>(6, 6) = Rs * Ts2;

    this->T = Rotsect * Ts * Tc;
}